

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssw.c
# Opt level: O1

alignment_end *
sw_sse2_word(int8_t *ref,int8_t ref_dir,int32_t refLen,int32_t readLen,uint8_t weight_gapO,
            uint8_t weight_gapE,__m128i *vProfile,uint16_t terminate,int32_t maskLen)

{
  short *psVar1;
  ulong *puVar2;
  ushort *puVar3;
  char cVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  ulong uVar10;
  undefined8 uVar11;
  void *pvVar12;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__ptr_02;
  void *__ptr_03;
  alignment_end *paVar13;
  uint16_t uVar14;
  int iVar15;
  ulong uVar16;
  size_t __nmemb;
  int iVar17;
  int iVar18;
  long lVar19;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  long lVar20;
  long lVar21;
  __m128i *pv;
  ushort uVar22;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  ushort uVar40;
  ushort uVar41;
  ushort uVar42;
  ushort uVar43;
  ushort uVar44;
  ushort uVar45;
  ushort uVar46;
  ushort uVar47;
  ushort uVar48;
  ushort uVar49;
  short sVar50;
  short sVar53;
  undefined1 auVar51 [16];
  short sVar54;
  undefined1 auVar52 [16];
  undefined1 auVar55 [16];
  short sVar58;
  short sVar59;
  short sVar60;
  short sVar61;
  short sVar62;
  short sVar63;
  undefined1 auVar56 [16];
  short sVar64;
  undefined1 auVar57 [16];
  ushort uVar65;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  undefined1 auVar66 [16];
  int local_60;
  short sVar74;
  
  uVar16 = (long)(readLen + 7) / 8;
  __ptr = calloc((long)refLen,2);
  iVar23 = (int)uVar16;
  __nmemb = (size_t)iVar23;
  __ptr_00 = calloc(__nmemb,0x10);
  __ptr_01 = calloc(__nmemb,0x10);
  __ptr_02 = calloc(__nmemb,0x10);
  __ptr_03 = calloc(__nmemb,0x10);
  iVar17 = refLen + -1;
  if (ref_dir != '\x01') {
    iVar17 = 0;
  }
  iVar15 = -1;
  if (ref_dir != '\x01') {
    iVar15 = refLen;
  }
  if (iVar17 == iVar15) {
    local_60 = 0;
    uVar22 = 0;
  }
  else {
    auVar24 = ZEXT416((uint)CONCAT71(in_register_00000081,weight_gapO));
    auVar24 = pshuflw(auVar24,auVar24,0);
    auVar24._4_4_ = auVar24._0_4_;
    auVar24._8_4_ = auVar24._0_4_;
    auVar24._12_4_ = auVar24._0_4_;
    auVar25 = ZEXT416((uint)CONCAT71(in_register_00000089,weight_gapE));
    auVar25 = pshuflw(auVar25,auVar25,0);
    auVar25._4_4_ = auVar25._0_4_;
    auVar25._8_4_ = auVar25._0_4_;
    auVar25._12_4_ = auVar25._0_4_;
    uVar10 = 1;
    if (1 < iVar23) {
      uVar10 = uVar16;
    }
    lVar21 = (long)iVar17;
    lVar20 = (uVar10 & 0xffffffff) * 0x10;
    uVar26 = 0;
    uVar27 = 0;
    uVar28 = 0;
    uVar29 = 0;
    uVar30 = 0;
    uVar31 = 0;
    uVar32 = 0;
    uVar33 = 0;
    uVar22 = 0;
    local_60 = 0;
    uVar34 = 0;
    uVar35 = 0;
    uVar36 = 0;
    uVar37 = 0;
    uVar38 = 0;
    uVar39 = 0;
    uVar40 = 0;
    uVar41 = 0;
    pvVar12 = __ptr_00;
    do {
      __ptr_00 = __ptr_01;
      __ptr_01 = pvVar12;
      auVar51 = (undefined1  [16])0x0;
      uVar42 = 0;
      uVar43 = 0;
      uVar44 = 0;
      uVar45 = 0;
      uVar46 = 0;
      uVar47 = 0;
      uVar48 = 0;
      uVar49 = 0;
      if (0 < readLen) {
        cVar4 = ref[lVar21];
        puVar2 = (ulong *)((long)__ptr_01 + (long)(iVar23 + -1) * 0x10);
        uVar16 = *puVar2;
        auVar56._0_8_ = uVar16 << 0x10;
        auVar56._8_8_ = puVar2[1] << 0x10 | uVar16 >> 0x30;
        lVar19 = 0;
        do {
          auVar55 = paddsw(auVar56,*(undefined1 (*) [16])((long)vProfile[cVar4 * iVar23] + lVar19));
          auVar56 = *(undefined1 (*) [16])((long)__ptr_02 + lVar19);
          sVar53 = auVar51._0_2_;
          sVar54 = auVar56._0_2_;
          uVar65 = (ushort)(sVar54 < sVar53) * sVar53 | (ushort)(sVar54 >= sVar53) * sVar54;
          sVar53 = auVar51._2_2_;
          sVar54 = auVar56._2_2_;
          uVar67 = (ushort)(sVar54 < sVar53) * sVar53 | (ushort)(sVar54 >= sVar53) * sVar54;
          sVar53 = auVar51._4_2_;
          sVar54 = auVar56._4_2_;
          uVar68 = (ushort)(sVar54 < sVar53) * sVar53 | (ushort)(sVar54 >= sVar53) * sVar54;
          sVar53 = auVar51._6_2_;
          sVar54 = auVar56._6_2_;
          uVar69 = (ushort)(sVar54 < sVar53) * sVar53 | (ushort)(sVar54 >= sVar53) * sVar54;
          sVar53 = auVar51._8_2_;
          sVar54 = auVar56._8_2_;
          uVar70 = (ushort)(sVar54 < sVar53) * sVar53 | (ushort)(sVar54 >= sVar53) * sVar54;
          sVar53 = auVar51._10_2_;
          sVar54 = auVar56._10_2_;
          uVar71 = (ushort)(sVar54 < sVar53) * sVar53 | (ushort)(sVar54 >= sVar53) * sVar54;
          sVar53 = auVar51._12_2_;
          sVar54 = auVar56._12_2_;
          sVar74 = auVar56._14_2_;
          uVar72 = (ushort)(sVar54 < sVar53) * sVar53 | (ushort)(sVar54 >= sVar53) * sVar54;
          sVar53 = auVar51._14_2_;
          uVar73 = (ushort)(sVar74 < sVar53) * sVar53 | (ushort)(sVar74 >= sVar53) * sVar74;
          sVar53 = auVar55._0_2_;
          auVar66._0_2_ =
               (ushort)((short)uVar65 < sVar53) * sVar53 | ((short)uVar65 >= sVar53) * uVar65;
          sVar53 = auVar55._2_2_;
          auVar66._2_2_ =
               (ushort)((short)uVar67 < sVar53) * sVar53 | ((short)uVar67 >= sVar53) * uVar67;
          sVar53 = auVar55._4_2_;
          auVar66._4_2_ =
               (ushort)((short)uVar68 < sVar53) * sVar53 | ((short)uVar68 >= sVar53) * uVar68;
          sVar53 = auVar55._6_2_;
          auVar66._6_2_ =
               (ushort)((short)uVar69 < sVar53) * sVar53 | ((short)uVar69 >= sVar53) * uVar69;
          sVar53 = auVar55._8_2_;
          auVar66._8_2_ =
               (ushort)((short)uVar70 < sVar53) * sVar53 | ((short)uVar70 >= sVar53) * uVar70;
          sVar53 = auVar55._10_2_;
          auVar66._10_2_ =
               (ushort)((short)uVar71 < sVar53) * sVar53 | ((short)uVar71 >= sVar53) * uVar71;
          sVar53 = auVar55._12_2_;
          auVar66._12_2_ =
               (ushort)((short)uVar72 < sVar53) * sVar53 | ((short)uVar72 >= sVar53) * uVar72;
          sVar53 = auVar55._14_2_;
          auVar66._14_2_ =
               (ushort)((short)uVar73 < sVar53) * sVar53 | ((short)uVar73 >= sVar53) * uVar73;
          uVar42 = ((short)uVar42 < (short)auVar66._0_2_) * auVar66._0_2_ |
                   ((short)uVar42 >= (short)auVar66._0_2_) * uVar42;
          uVar43 = ((short)uVar43 < (short)auVar66._2_2_) * auVar66._2_2_ |
                   ((short)uVar43 >= (short)auVar66._2_2_) * uVar43;
          uVar44 = ((short)uVar44 < (short)auVar66._4_2_) * auVar66._4_2_ |
                   ((short)uVar44 >= (short)auVar66._4_2_) * uVar44;
          uVar45 = ((short)uVar45 < (short)auVar66._6_2_) * auVar66._6_2_ |
                   ((short)uVar45 >= (short)auVar66._6_2_) * uVar45;
          uVar46 = ((short)uVar46 < (short)auVar66._8_2_) * auVar66._8_2_ |
                   ((short)uVar46 >= (short)auVar66._8_2_) * uVar46;
          uVar47 = ((short)uVar47 < (short)auVar66._10_2_) * auVar66._10_2_ |
                   ((short)uVar47 >= (short)auVar66._10_2_) * uVar47;
          uVar48 = ((short)uVar48 < (short)auVar66._12_2_) * auVar66._12_2_ |
                   ((short)uVar48 >= (short)auVar66._12_2_) * uVar48;
          uVar49 = ((short)uVar49 < (short)auVar66._14_2_) * auVar66._14_2_ |
                   ((short)uVar49 >= (short)auVar66._14_2_) * uVar49;
          *(undefined1 (*) [16])((long)__ptr_00 + lVar19) = auVar66;
          auVar55 = psubusw(auVar66,auVar24);
          auVar56 = psubusw(auVar56,auVar25);
          sVar53 = auVar55._0_2_;
          sVar50 = auVar56._0_2_;
          sVar54 = auVar55._2_2_;
          sVar58 = auVar56._2_2_;
          sVar74 = auVar55._4_2_;
          sVar59 = auVar56._4_2_;
          sVar5 = auVar55._6_2_;
          sVar60 = auVar56._6_2_;
          sVar6 = auVar55._8_2_;
          sVar61 = auVar56._8_2_;
          sVar7 = auVar55._10_2_;
          sVar62 = auVar56._10_2_;
          sVar8 = auVar55._12_2_;
          sVar63 = auVar56._12_2_;
          sVar64 = auVar56._14_2_;
          sVar9 = auVar55._14_2_;
          puVar3 = (ushort *)((long)__ptr_02 + lVar19);
          *puVar3 = (ushort)(sVar50 < sVar53) * sVar53 | (ushort)(sVar50 >= sVar53) * sVar50;
          puVar3[1] = (ushort)(sVar58 < sVar54) * sVar54 | (ushort)(sVar58 >= sVar54) * sVar58;
          puVar3[2] = (ushort)(sVar59 < sVar74) * sVar74 | (ushort)(sVar59 >= sVar74) * sVar59;
          puVar3[3] = (ushort)(sVar60 < sVar5) * sVar5 | (ushort)(sVar60 >= sVar5) * sVar60;
          puVar3[4] = (ushort)(sVar61 < sVar6) * sVar6 | (ushort)(sVar61 >= sVar6) * sVar61;
          puVar3[5] = (ushort)(sVar62 < sVar7) * sVar7 | (ushort)(sVar62 >= sVar7) * sVar62;
          puVar3[6] = (ushort)(sVar63 < sVar8) * sVar8 | (ushort)(sVar63 >= sVar8) * sVar63;
          puVar3[7] = (ushort)(sVar64 < sVar9) * sVar9 | (ushort)(sVar64 >= sVar9) * sVar64;
          auVar56 = psubusw(auVar51,auVar25);
          sVar50 = auVar56._0_2_;
          auVar51._0_2_ = (ushort)(sVar50 < sVar53) * sVar53 | (ushort)(sVar50 >= sVar53) * sVar50;
          sVar53 = auVar56._2_2_;
          auVar51._2_2_ = (ushort)(sVar53 < sVar54) * sVar54 | (ushort)(sVar53 >= sVar54) * sVar53;
          sVar53 = auVar56._4_2_;
          auVar51._4_2_ = (ushort)(sVar53 < sVar74) * sVar74 | (ushort)(sVar53 >= sVar74) * sVar53;
          sVar53 = auVar56._6_2_;
          auVar51._6_2_ = (ushort)(sVar53 < sVar5) * sVar5 | (ushort)(sVar53 >= sVar5) * sVar53;
          sVar53 = auVar56._8_2_;
          auVar51._8_2_ = (ushort)(sVar53 < sVar6) * sVar6 | (ushort)(sVar53 >= sVar6) * sVar53;
          sVar53 = auVar56._10_2_;
          auVar51._10_2_ = (ushort)(sVar53 < sVar7) * sVar7 | (ushort)(sVar53 >= sVar7) * sVar53;
          sVar53 = auVar56._12_2_;
          sVar54 = auVar56._14_2_;
          auVar51._12_2_ = (ushort)(sVar53 < sVar8) * sVar8 | (ushort)(sVar53 >= sVar8) * sVar53;
          auVar51._14_2_ = (ushort)(sVar54 < sVar9) * sVar9 | (ushort)(sVar54 >= sVar9) * sVar54;
          auVar56 = *(undefined1 (*) [16])((long)__ptr_01 + lVar19);
          lVar19 = lVar19 + 0x10;
        } while (lVar20 != lVar19);
      }
      iVar17 = 0;
      do {
        lVar19 = auVar51._8_8_;
        uVar16 = auVar51._0_8_;
        auVar51._0_8_ = uVar16 << 0x10;
        auVar51._8_8_ = lVar19 << 0x10 | uVar16 >> 0x30;
        if (0 < readLen) {
          lVar19 = 0;
          do {
            psVar1 = (short *)((long)__ptr_00 + lVar19);
            sVar54 = *psVar1;
            sVar74 = psVar1[1];
            sVar5 = psVar1[2];
            sVar6 = psVar1[3];
            sVar7 = psVar1[4];
            sVar8 = psVar1[5];
            sVar9 = psVar1[6];
            sVar50 = psVar1[7];
            sVar53 = auVar51._0_2_;
            auVar55._0_2_ = (ushort)(sVar54 < sVar53) * sVar53 | (ushort)(sVar54 >= sVar53) * sVar54
            ;
            sVar53 = auVar51._2_2_;
            auVar55._2_2_ = (ushort)(sVar74 < sVar53) * sVar53 | (ushort)(sVar74 >= sVar53) * sVar74
            ;
            sVar53 = auVar51._4_2_;
            auVar55._4_2_ = (ushort)(sVar5 < sVar53) * sVar53 | (ushort)(sVar5 >= sVar53) * sVar5;
            sVar53 = auVar51._6_2_;
            auVar55._6_2_ = (ushort)(sVar6 < sVar53) * sVar53 | (ushort)(sVar6 >= sVar53) * sVar6;
            sVar53 = auVar51._8_2_;
            auVar55._8_2_ = (ushort)(sVar7 < sVar53) * sVar53 | (ushort)(sVar7 >= sVar53) * sVar7;
            sVar53 = auVar51._10_2_;
            auVar55._10_2_ = (ushort)(sVar8 < sVar53) * sVar53 | (ushort)(sVar8 >= sVar53) * sVar8;
            sVar53 = auVar51._12_2_;
            auVar55._12_2_ = (ushort)(sVar9 < sVar53) * sVar53 | (ushort)(sVar9 >= sVar53) * sVar9;
            sVar53 = auVar51._14_2_;
            auVar55._14_2_ =
                 (ushort)(sVar50 < sVar53) * sVar53 | (ushort)(sVar50 >= sVar53) * sVar50;
            uVar42 = ((short)uVar42 < (short)auVar55._0_2_) * auVar55._0_2_ |
                     ((short)uVar42 >= (short)auVar55._0_2_) * uVar42;
            uVar43 = ((short)uVar43 < (short)auVar55._2_2_) * auVar55._2_2_ |
                     ((short)uVar43 >= (short)auVar55._2_2_) * uVar43;
            uVar44 = ((short)uVar44 < (short)auVar55._4_2_) * auVar55._4_2_ |
                     ((short)uVar44 >= (short)auVar55._4_2_) * uVar44;
            uVar45 = ((short)uVar45 < (short)auVar55._6_2_) * auVar55._6_2_ |
                     ((short)uVar45 >= (short)auVar55._6_2_) * uVar45;
            uVar46 = ((short)uVar46 < (short)auVar55._8_2_) * auVar55._8_2_ |
                     ((short)uVar46 >= (short)auVar55._8_2_) * uVar46;
            uVar47 = ((short)uVar47 < (short)auVar55._10_2_) * auVar55._10_2_ |
                     ((short)uVar47 >= (short)auVar55._10_2_) * uVar47;
            uVar48 = ((short)uVar48 < (short)auVar55._12_2_) * auVar55._12_2_ |
                     ((short)uVar48 >= (short)auVar55._12_2_) * uVar48;
            uVar49 = ((short)uVar49 < (short)auVar55._14_2_) * auVar55._14_2_ |
                     ((short)uVar49 >= (short)auVar55._14_2_) * uVar49;
            *(undefined1 (*) [16])((long)__ptr_00 + lVar19) = auVar55;
            auVar56 = psubusw(auVar55,auVar24);
            auVar51 = psubusw(auVar51,auVar25);
            auVar57._0_2_ = -(ushort)(auVar56._0_2_ < auVar51._0_2_);
            auVar57._2_2_ = -(ushort)(auVar56._2_2_ < auVar51._2_2_);
            auVar57._4_2_ = -(ushort)(auVar56._4_2_ < auVar51._4_2_);
            auVar57._6_2_ = -(ushort)(auVar56._6_2_ < auVar51._6_2_);
            auVar57._8_2_ = -(ushort)(auVar56._8_2_ < auVar51._8_2_);
            auVar57._10_2_ = -(ushort)(auVar56._10_2_ < auVar51._10_2_);
            auVar57._12_2_ = -(ushort)(auVar56._12_2_ < auVar51._12_2_);
            auVar57._14_2_ = -(ushort)(auVar56._14_2_ < auVar51._14_2_);
            if ((((((((((((((((auVar57 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                             (auVar57 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar57 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar57 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar57 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar57 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar57 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar57 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar57 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar57 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar57 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar57 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar57 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar57 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar57._14_2_ >> 7 & 1) == 0) && (auVar57._14_2_ & 0x8000) == 0)
            goto LAB_00102bf0;
            lVar19 = lVar19 + 0x10;
          } while (lVar20 != lVar19);
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 != 8);
LAB_00102bf0:
      uVar26 = ((short)uVar26 < (short)uVar42) * uVar42 | ((short)uVar26 >= (short)uVar42) * uVar26;
      uVar27 = ((short)uVar27 < (short)uVar43) * uVar43 | ((short)uVar27 >= (short)uVar43) * uVar27;
      uVar28 = ((short)uVar28 < (short)uVar44) * uVar44 | ((short)uVar28 >= (short)uVar44) * uVar28;
      uVar29 = ((short)uVar29 < (short)uVar45) * uVar45 | ((short)uVar29 >= (short)uVar45) * uVar29;
      uVar30 = ((short)uVar30 < (short)uVar46) * uVar46 | ((short)uVar30 >= (short)uVar46) * uVar30;
      uVar31 = ((short)uVar31 < (short)uVar47) * uVar47 | ((short)uVar31 >= (short)uVar47) * uVar31;
      uVar32 = ((short)uVar32 < (short)uVar48) * uVar48 | ((short)uVar32 >= (short)uVar48) * uVar32;
      uVar33 = ((short)uVar33 < (short)uVar49) * uVar49 | ((short)uVar33 >= (short)uVar49) * uVar33;
      auVar52._0_2_ = -(ushort)(uVar34 == uVar26);
      auVar52._2_2_ = -(ushort)(uVar35 == uVar27);
      auVar52._4_2_ = -(ushort)(uVar36 == uVar28);
      auVar52._6_2_ = -(ushort)(uVar37 == uVar29);
      auVar52._8_2_ = -(ushort)(uVar38 == uVar30);
      auVar52._10_2_ = -(ushort)(uVar39 == uVar31);
      auVar52._12_2_ = -(ushort)(uVar40 == uVar32);
      auVar52._14_2_ = -(ushort)(uVar41 == uVar33);
      if ((ushort)((ushort)(SUB161(auVar52 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                   (ushort)((byte)(auVar52._14_2_ >> 7) & 1) << 0xe | auVar52._14_2_ & 0x8000) !=
          0xffff) {
        uVar34 = ((short)uVar30 < (short)uVar26) * uVar26 |
                 ((short)uVar30 >= (short)uVar26) * uVar30;
        uVar35 = ((short)uVar31 < (short)uVar27) * uVar27 |
                 ((short)uVar31 >= (short)uVar27) * uVar31;
        uVar36 = ((short)uVar32 < (short)uVar28) * uVar28 |
                 ((short)uVar32 >= (short)uVar28) * uVar32;
        uVar37 = ((short)uVar33 < (short)uVar29) * uVar29 |
                 ((short)uVar33 >= (short)uVar29) * uVar33;
        uVar34 = ((short)uVar36 < (short)uVar34) * uVar34 |
                 ((short)uVar36 >= (short)uVar34) * uVar36;
        uVar35 = ((short)uVar37 < (short)uVar35) * uVar35 |
                 ((short)uVar37 >= (short)uVar35) * uVar37;
        uVar65 = ((short)uVar35 < (short)uVar34) * uVar34 |
                 ((short)uVar35 >= (short)uVar34) * uVar35;
        uVar34 = uVar26;
        uVar35 = uVar27;
        uVar36 = uVar28;
        uVar37 = uVar29;
        uVar38 = uVar30;
        uVar39 = uVar31;
        uVar40 = uVar32;
        uVar41 = uVar33;
        if ((uVar22 < uVar65) && (local_60 = (int)lVar21, uVar22 = uVar65, 0 < readLen)) {
          lVar19 = 0;
          do {
            uVar11 = ((undefined8 *)((long)__ptr_00 + lVar19))[1];
            *(undefined8 *)((long)__ptr_03 + lVar19) = *(undefined8 *)((long)__ptr_00 + lVar19);
            ((undefined8 *)((long)__ptr_03 + lVar19))[1] = uVar11;
            lVar19 = lVar19 + 0x10;
          } while (lVar20 != lVar19);
        }
      }
      uVar42 = ((short)uVar46 < (short)uVar42) * uVar42 | ((short)uVar46 >= (short)uVar42) * uVar46;
      uVar43 = ((short)uVar47 < (short)uVar43) * uVar43 | ((short)uVar47 >= (short)uVar43) * uVar47;
      uVar44 = ((short)uVar48 < (short)uVar44) * uVar44 | ((short)uVar48 >= (short)uVar44) * uVar48;
      uVar45 = ((short)uVar49 < (short)uVar45) * uVar45 | ((short)uVar49 >= (short)uVar45) * uVar49;
      uVar42 = ((short)uVar44 < (short)uVar42) * uVar42 | ((short)uVar44 >= (short)uVar42) * uVar44;
      uVar43 = ((short)uVar45 < (short)uVar43) * uVar43 | ((short)uVar45 >= (short)uVar43) * uVar45;
      uVar42 = ((short)uVar43 < (short)uVar42) * uVar42 | ((short)uVar43 >= (short)uVar42) * uVar43;
      *(ushort *)((long)__ptr + lVar21 * 2) = uVar42;
    } while ((uVar42 != terminate) &&
            (lVar21 = lVar21 + (ulong)(ref_dir != '\x01') * 2 + -1, pvVar12 = __ptr_00,
            iVar15 != (int)lVar21));
  }
  iVar17 = readLen + -1;
  if (0 < readLen) {
    iVar15 = 1;
    if (1 < iVar23 * 8) {
      iVar15 = iVar23 * 8;
    }
    uVar16 = 0;
    do {
      if ((*(uint16_t *)((long)__ptr_03 + uVar16 * 2) == uVar22) &&
         (iVar18 = ((uint)uVar16 & 7) * iVar23 + ((uint)(uVar16 >> 3) & 0x1fffffff), iVar18 < iVar17
         )) {
        iVar17 = iVar18;
      }
      uVar16 = uVar16 + 1;
    } while (iVar15 != (int)uVar16);
  }
  free(__ptr_03);
  free(__ptr_02);
  free(__ptr_01);
  free(__ptr_00);
  paVar13 = (alignment_end *)calloc(2,0xc);
  paVar13->score = uVar22;
  paVar13->ref = local_60;
  paVar13->read = iVar17;
  paVar13[1].score = 0;
  paVar13[1].ref = 0;
  paVar13[1].read = 0;
  if (local_60 - maskLen != 0 && maskLen <= local_60) {
    uVar14 = paVar13[1].score;
    uVar16 = 0;
    do {
      uVar22 = *(ushort *)((long)__ptr + uVar16 * 2);
      if (uVar14 < uVar22) {
        paVar13[1].ref = (int32_t)uVar16;
        uVar14 = uVar22;
      }
      uVar16 = uVar16 + 1;
    } while ((uint)(local_60 - maskLen) != uVar16);
    paVar13[1].score = uVar14;
  }
  local_60 = local_60 + maskLen;
  if (local_60 < refLen) {
    uVar14 = paVar13[1].score;
    lVar20 = (long)local_60;
    do {
      uVar22 = *(ushort *)((long)__ptr + lVar20 * 2);
      if (uVar14 < uVar22) {
        paVar13[1].ref = local_60;
        uVar14 = uVar22;
      }
      lVar20 = lVar20 + 1;
      local_60 = local_60 + 1;
    } while (lVar20 < refLen);
    paVar13[1].score = uVar14;
  }
  free(__ptr);
  return paVar13;
}

Assistant:

static alignment_end* sw_sse2_word (const int8_t* ref,
							 int8_t ref_dir,	/* 0: forward ref; 1: reverse ref*/
							 int32_t refLen,
							 int32_t readLen,
							 const uint8_t weight_gapO, /* will be used as - */
							 const uint8_t weight_gapE, /* will be used as - */
							 const __m128i* vProfile,
							 uint16_t terminate,
							 int32_t maskLen) {

#define max8(m, vm) (vm) = _mm_max_epi16((vm), _mm_srli_si128((vm), 8)); \
					(vm) = _mm_max_epi16((vm), _mm_srli_si128((vm), 4)); \
					(vm) = _mm_max_epi16((vm), _mm_srli_si128((vm), 2)); \
					(m) = _mm_extract_epi16((vm), 0)

	uint16_t max = 0;		                     /* the max alignment score */
	int32_t end_read = readLen - 1;
	int32_t end_ref = 0; /* 1_based best alignment ending point; Initialized as isn't aligned - 0. */
	int32_t segLen = (readLen + 7) / 8; /* number of segment */

	/* array to record the largest score of each reference position */
	uint16_t* maxColumn = (uint16_t*) calloc(refLen, 2);

	/* array to record the alignment read ending position of the largest score of each reference position */
	int32_t* end_read_column = (int32_t*) calloc(refLen, sizeof(int32_t));

	/* Define 16 byte 0 vector. */
	__m128i vZero = _mm_set1_epi32(0);

	__m128i* pvHStore = (__m128i*) calloc(segLen, sizeof(__m128i));
	__m128i* pvHLoad = (__m128i*) calloc(segLen, sizeof(__m128i));
	__m128i* pvE = (__m128i*) calloc(segLen, sizeof(__m128i));
	__m128i* pvHmax = (__m128i*) calloc(segLen, sizeof(__m128i));

	int32_t i, j, k;
	/* 16 byte insertion begin vector */
	__m128i vGapO = _mm_set1_epi16(weight_gapO);

	/* 16 byte insertion extension vector */
	__m128i vGapE = _mm_set1_epi16(weight_gapE);

	__m128i vMaxScore = vZero; /* Trace the highest score of the whole SW matrix. */
	__m128i vMaxMark = vZero; /* Trace the highest score till the previous column. */
	__m128i vTemp;
	int32_t edge, begin = 0, end = refLen, step = 1;
	uint16_t *t;
	int32_t column_len;
	alignment_end* bests;

	/* outer loop to process the reference sequence */
	if (ref_dir == 1) {
		begin = refLen - 1;
		end = -1;
		step = -1;
	}
	for (i = begin; LIKELY(i != end); i += step) {
		__m128i* pv;
		__m128i vMaxColumn;
		const __m128i* vP;
		int32_t cmp;
		__m128i e, vF = vZero; /* Initialize F value to 0.
							   Any errors to vH values will be corrected in the Lazy_F loop.
							 */
		__m128i vH = pvHStore[segLen - 1];
		vH = _mm_slli_si128 (vH, 2); /* Shift the 128-bit value in vH left by 2 byte. */

		/* Swap the 2 H buffers. */
		pv = pvHLoad;

		vMaxColumn = vZero; /* vMaxColumn is used to record the max values of column i. */

		vP = vProfile + ref[i] * segLen; /* Right part of the vProfile */
		pvHLoad = pvHStore;
		pvHStore = pv;

		/* inner loop to process the query sequence */
		for (j = 0; LIKELY(j < segLen); j ++) {
			vH = _mm_adds_epi16(vH, _mm_load_si128(vP + j));

			/* Get max from vH, vE and vF. */
			e = _mm_load_si128(pvE + j);
			vH = _mm_max_epi16(vH, e);
			vH = _mm_max_epi16(vH, vF);
			vMaxColumn = _mm_max_epi16(vMaxColumn, vH);

			/* Save vH values. */
			_mm_store_si128(pvHStore + j, vH);

			/* Update vE value. */
			vH = _mm_subs_epu16(vH, vGapO); /* saturation arithmetic, result >= 0 */
			e = _mm_subs_epu16(e, vGapE);
			e = _mm_max_epi16(e, vH);
			_mm_store_si128(pvE + j, e);

			/* Update vF value. */
			vF = _mm_subs_epu16(vF, vGapE);
			vF = _mm_max_epi16(vF, vH);

			/* Load the next vH. */
			vH = _mm_load_si128(pvHLoad + j);
		}

		/* Lazy_F loop: has been revised to disallow adjecent insertion and then deletion, so don't update E(i, j), learn from SWPS3 */
		for (k = 0; LIKELY(k < 8); ++k) {
			vF = _mm_slli_si128 (vF, 2);
			for (j = 0; LIKELY(j < segLen); ++j) {
				vH = _mm_load_si128(pvHStore + j);
				vH = _mm_max_epi16(vH, vF);
				vMaxColumn = _mm_max_epi16(vMaxColumn, vH); /*newly added line*/
				_mm_store_si128(pvHStore + j, vH);
				vH = _mm_subs_epu16(vH, vGapO);
				vF = _mm_subs_epu16(vF, vGapE);
				if (UNLIKELY(! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH)))) goto end;
			}
		}

end:
		vMaxScore = _mm_max_epi16(vMaxScore, vMaxColumn);
		vTemp = _mm_cmpeq_epi16(vMaxMark, vMaxScore);
		cmp = _mm_movemask_epi8(vTemp);
		if (cmp != 0xffff) {
			uint16_t temp;
			vMaxMark = vMaxScore;
			max8(temp, vMaxScore);
			vMaxScore = vMaxMark;

			if (LIKELY(temp > max)) {
				max = temp;
				end_ref = i;
				for (j = 0; LIKELY(j < segLen); ++j) pvHmax[j] = pvHStore[j];
			}
		}

		/* Record the max score of current column. */
		max8(maxColumn[i], vMaxColumn);
		if (maxColumn[i] == terminate) break;
	}

	/* Trace the alignment ending position on read. */
	t = (uint16_t*)pvHmax;
	column_len = segLen * 8;
	for (i = 0; LIKELY(i < column_len); ++i, ++t) {
		int32_t temp;
		if (*t == max) {
			temp = i / 8 + i % 8 * segLen;
			if (temp < end_read) end_read = temp;
		}
	}

	free(pvHmax);
	free(pvE);
	free(pvHLoad);
	free(pvHStore);

	/* Find the most possible 2nd best alignment. */
	bests = (alignment_end*) calloc(2, sizeof(alignment_end));
	bests[0].score = max;
	bests[0].ref = end_ref;
	bests[0].read = end_read;

	bests[1].score = 0;
	bests[1].ref = 0;
	bests[1].read = 0;

	edge = (end_ref - maskLen) > 0 ? (end_ref - maskLen) : 0;
	for (i = 0; i < edge; i ++) {
		if (maxColumn[i] > bests[1].score) {
			bests[1].score = maxColumn[i];
			bests[1].ref = i;
		}
	}
	edge = (end_ref + maskLen) > refLen ? refLen : (end_ref + maskLen);
	for (i = edge; i < refLen; i ++) {
		if (maxColumn[i] > bests[1].score) {
			bests[1].score = maxColumn[i];
			bests[1].ref = i;
		}
	}

	free(maxColumn);
	free(end_read_column);
	return bests;
}